

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolStatisticsTest<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsSecondaryTestInstance>
::QueryPoolStatisticsTest
          (QueryPoolStatisticsTest<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsSecondaryTestInstance>
           *this,TestContext *context,char *name,char *description)

{
  char *__s;
  ostream *this_00;
  undefined1 local_290 [8];
  ParametersCompute prameters;
  ostringstream shaderName;
  int local_dc;
  undefined1 local_d8 [4];
  int shaderNdx;
  UVec3 groupSize [3];
  undefined1 local_a8 [8];
  UVec3 localSize [3];
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *description_local;
  char *name_local;
  TestContext *context_local;
  QueryPoolStatisticsTest<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsSecondaryTestInstance>
  *this_local;
  
  local_28 = description;
  description_local = name;
  name_local = (char *)context;
  context_local = (TestContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
  __s = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(localSize[2].m_data + 2),__s,
             (allocator<char> *)((long)localSize[2].m_data + 7));
  TestCase::TestCase(&this->super_TestCase,context,&local_48,(string *)(localSize[2].m_data + 2));
  std::__cxx11::string::~string((string *)(localSize[2].m_data + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)localSize[2].m_data + 7));
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__QueryPoolStatisticsTest_01669910;
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
  ::vector(&this->m_parameters);
  tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)local_a8,2,2,2);
  tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)(localSize[0].m_data + 1),1,1,1);
  tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)(localSize[1].m_data + 1),3,7,3);
  tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)local_d8,2,2,2);
  tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)(groupSize[0].m_data + 1),3,7,3);
  tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)(groupSize[1].m_data + 1),1,1,1);
  for (local_dc = 0; local_dc < 3; local_dc = local_dc + 1) {
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)(prameters.shaderName.field_2._M_local_buf + 8));
    this_00 = std::operator<<((ostream *)(prameters.shaderName.field_2._M_local_buf + 8),"compute_")
    ;
    std::ostream::operator<<(this_00,local_dc);
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)local_290,
               (Vector<unsigned_int,_3> *)(localSize[(long)local_dc + -1].m_data + 1));
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)(prameters.localSize.m_data + 1),
               (Vector<unsigned_int,_3> *)(local_d8 + (long)local_dc * 0xc));
    std::__cxx11::ostringstream::str();
    std::
    vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
    ::push_back(&this->m_parameters,(value_type *)local_290);
    ComputeInvocationsTestInstance::ParametersCompute::~ParametersCompute
              ((ParametersCompute *)local_290);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)(prameters.shaderName.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

QueryPoolStatisticsTest (tcu::TestContext &context, const char *name, const char *description)
		: TestCase			(context, name, description)
	{
		const tcu::UVec3	localSize[]		=
		{
			tcu::UVec3	(2u,			2u,	2u),
			tcu::UVec3	(1u,			1u,	1u),
			tcu::UVec3	(WIDTH/(7u*3u),	7u,	3u),
		};

		const tcu::UVec3	groupSize[]		=
		{
			tcu::UVec3	(2u,			2u,	2u),
			tcu::UVec3	(WIDTH/(7u*3u),	7u,	3u),
			tcu::UVec3	(1u,			1u,	1u),
		};

		DE_ASSERT(DE_LENGTH_OF_ARRAY(localSize) == DE_LENGTH_OF_ARRAY(groupSize));

		for(int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(localSize); ++shaderNdx)
		{
			std::ostringstream	shaderName;
			shaderName<< "compute_" << shaderNdx;
			const ComputeInvocationsTestInstance::ParametersCompute	prameters	=
			{
				localSize[shaderNdx],
				groupSize[shaderNdx],
				shaderName.str(),
			};
			m_parameters.push_back(prameters);
		}
	}